

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_parser.hpp
# Opt level: O0

void __thiscall
jsoncons::cbor::
basic_cbor_parser<jsoncons::binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<char>_>
::end_object(basic_cbor_parser<jsoncons::binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<char>_>
             *this,item_event_visitor *visitor,error_code *ec)

{
  int iVar1;
  reference pvVar2;
  vector<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_> *in_RDI;
  ser_context *in_stack_ffffffffffffffd8;
  
  *(int *)&in_RDI[1].
           super__Vector_base<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_>
           ._M_impl.super__Vector_impl_data._M_start =
       *(int *)&in_RDI[1].
                super__Vector_base<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_>
                ._M_impl.super__Vector_impl_data._M_start + -1;
  basic_item_event_visitor<char>::end_object
            ((basic_item_event_visitor<char> *)in_RDI,in_stack_ffffffffffffffd8,
             (error_code *)0x3495c5);
  iVar1 = level((basic_cbor_parser<jsoncons::binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<char>_>
                 *)0x3495cf);
  if (iVar1 == *(int *)((long)&(in_RDI->
                               super__Vector_base<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_>
                               )._M_impl.super__Vector_impl_data._M_finish + 4)) {
    *(undefined1 *)
     &(in_RDI->
      super__Vector_base<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_>)
      ._M_impl.super__Vector_impl_data._M_finish = 0;
  }
  *(byte *)&(in_RDI->
            super__Vector_base<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_>
            )._M_impl.super__Vector_impl_data._M_finish =
       (*(byte *)((long)&(in_RDI->
                         super__Vector_base<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_>
                         )._M_impl.super__Vector_impl_data._M_finish + 2) ^ 0xff) & 1;
  pvVar2 = std::vector<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_>::
           back(in_RDI);
  if ((pvVar2->pop_stringref_map_stack & 1U) != 0) {
    std::
    vector<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<char>_>::mapped_string>_>,_std::allocator<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<char>_>::mapped_string>_>_>_>
    ::pop_back((vector<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<char>_>::mapped_string>_>,_std::allocator<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<char>_>::mapped_string>_>_>_>
                *)0x349614);
  }
  std::vector<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_>::pop_back
            ((vector<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_> *)
             0x349625);
  return;
}

Assistant:

void end_object(item_event_visitor& visitor, std::error_code& ec)
    {
        --nesting_depth_;
        visitor.end_object(*this, ec);
        if (level() == mark_level_)
        {
            more_ = false;
        }
        more_ = !cursor_mode_;
        if (state_stack_.back().pop_stringref_map_stack)
        {
            stringref_map_stack_.pop_back();
        }
        state_stack_.pop_back();
    }